

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O3

void anon_unknown.dwarf_7e6f::assert_key_eq(art_key_chunk_t *key1,art_key_chunk_t *key2)

{
  size_t i;
  size_t i_1;
  long lVar1;
  
  lVar1 = 0;
  do {
    if (key1[lVar1] != key2[lVar1]) {
      lVar1 = 0;
      do {
        printf("%x",(ulong)key1[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 != 6);
      printf(" != ");
      lVar1 = 0;
      do {
        printf("%x",(ulong)key2[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 != 6);
      putchar(10);
      _fail("/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
            ,0x21);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 6);
  return;
}

Assistant:

void assert_key_eq(const art_key_chunk_t* key1, const art_key_chunk_t* key2) {
    for (size_t i = 0; i < ART_KEY_BYTES; ++i) {
        if (*(key1 + i) != *(key2 + i)) {
            print_key(key1);
            printf(" != ");
            print_key(key2);
            printf("\n");

            fail();
        }
    }
}